

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void setContentAreaOpaque(_GLFWwindow *window)

{
  uint uVar1;
  uint uVar2;
  wl_proxy *pwVar3;
  wl_compositor *pwVar4;
  PFN_wl_proxy_marshal_flags UNRECOVERED_JUMPTABLE;
  uint32_t uVar5;
  wl_proxy *pwVar6;
  
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar4 = _glfw.wl.compositor;
  uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.compositor);
  pwVar6 = (*UNRECOVERED_JUMPTABLE)((wl_proxy *)pwVar4,1,&_glfw_wl_region_interface,uVar5,0,0);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  if (pwVar6 != (wl_proxy *)0x0) {
    uVar1 = (window->wl).width;
    uVar2 = (window->wl).height;
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
    (*UNRECOVERED_JUMPTABLE)(pwVar6,1,(wl_interface *)0x0,uVar5,0,0,0,(ulong)uVar1,(ulong)uVar2);
    UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
    pwVar3 = (wl_proxy *)(window->wl).surface;
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar3);
    (*UNRECOVERED_JUMPTABLE)(pwVar3,4,(wl_interface *)0x0,uVar5,0,pwVar6);
    UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
    (*UNRECOVERED_JUMPTABLE)(pwVar6,0,(wl_interface *)0x0,uVar5,1,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

static void setContentAreaOpaque(_GLFWwindow* window)
{
    struct wl_region* region;

    region = wl_compositor_create_region(_glfw.wl.compositor);
    if (!region)
        return;

    wl_region_add(region, 0, 0, window->wl.width, window->wl.height);
    wl_surface_set_opaque_region(window->wl.surface, region);
    wl_region_destroy(region);
}